

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  int value;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    iVar2 = stbi__at_eof(s);
    if ((iVar2 != 0) || ((byte)(*c - 0x3aU) < 0xf6)) break;
    iVar3 = iVar3 * 10 + -0x30 + (uint)(byte)*c;
    sVar1 = stbi__get8(s);
    *c = sVar1;
  }
  return iVar3;
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
   }

   return value;
}